

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O3

void __thiscall BtorSimVCDWriter::update_time(BtorSimVCDWriter *this,int64_t k)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  int64_t id;
  bool bVar5;
  uint uVar6;
  long *plVar7;
  undefined8 *puVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  size_type *psVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  ulong local_40;
  int64_t local_38;
  
  if (this->current_step < k) {
    if (k < 1) {
      uVar14 = k * 10;
    }
    else {
      uVar14 = k * 10 - 5;
      uVar13 = 1;
      if (9 < uVar14) {
        uVar10 = uVar14;
        uVar6 = 4;
        do {
          uVar13 = uVar6;
          if (uVar10 < 100) {
            uVar13 = uVar13 - 2;
            goto LAB_0010c76a;
          }
          if (uVar10 < 1000) {
            uVar13 = uVar13 - 1;
            goto LAB_0010c76a;
          }
          if (uVar10 < 10000) goto LAB_0010c76a;
          bVar5 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          uVar6 = uVar13 + 4;
        } while (bVar5);
        uVar13 = uVar13 + 1;
      }
LAB_0010c76a:
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      local_38 = k;
      std::__cxx11::string::_M_construct
                ((ulong)&local_60,(char)uVar13 - (char)((long)uVar14 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_60._M_dataplus._M_p + -((long)uVar14 >> 0x3f),uVar13,uVar14);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x11620c);
      pvVar1 = &this->value_changes;
      paVar3 = &local_80.field_2;
      psVar11 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_80.field_2._M_allocated_capacity = *psVar11;
        local_80.field_2._8_8_ = plVar7[3];
        local_80._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar11;
        local_80._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_80._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 &local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar3) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      local_40 = k * 10;
      p_Var9 = (this->clocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var2 = &(this->clocks)._M_t._M_impl.super__Rb_tree_header;
      k = local_38;
      uVar14 = local_40;
      if ((_Rb_tree_header *)p_Var9 != p_Var2) {
        do {
          if (*(int *)&p_Var9[1]._M_parent == 1) {
            get_bv_identifier_abi_cxx11_(&local_60,this,*(int64_t *)(p_Var9 + 1));
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x117c71);
            psVar11 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_80.field_2._M_allocated_capacity = *psVar11;
              local_80.field_2._8_8_ = puVar8[3];
              local_80._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              local_80.field_2._M_allocated_capacity = *psVar11;
              local_80._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_80._M_string_length = puVar8[1];
            *puVar8 = psVar11;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                       &local_80);
LAB_0010c960:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar3) {
              operator_delete(local_80._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p);
            }
          }
          else if (*(int *)&p_Var9[1]._M_parent == 0) {
            get_bv_identifier_abi_cxx11_(&local_60,this,*(int64_t *)(p_Var9 + 1));
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x117122);
            psVar11 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_80.field_2._M_allocated_capacity = *psVar11;
              local_80.field_2._8_8_ = puVar8[3];
              local_80._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              local_80.field_2._M_allocated_capacity = *psVar11;
              local_80._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_80._M_string_length = puVar8[1];
            *puVar8 = psVar11;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                       &local_80);
            goto LAB_0010c960;
          }
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          k = local_38;
          uVar14 = local_40;
        } while ((_Rb_tree_header *)p_Var9 != p_Var2);
      }
    }
    uVar10 = -uVar14;
    if (0 < (long)uVar14) {
      uVar10 = uVar14;
    }
    uVar13 = 1;
    if (9 < uVar10) {
      uVar12 = uVar10;
      uVar6 = 4;
      do {
        uVar13 = uVar6;
        if (uVar12 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_0010ca0b;
        }
        if (uVar12 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_0010ca0b;
        }
        if (uVar12 < 10000) goto LAB_0010ca0b;
        bVar5 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        uVar6 = uVar13 + 4;
      } while (bVar5);
      uVar13 = uVar13 + 1;
    }
LAB_0010ca0b:
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_60,(char)uVar13 - (char)((long)uVar14 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_60._M_dataplus._M_p + -((long)uVar14 >> 0x3f),uVar13,uVar10);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x11620c);
    pvVar1 = &this->value_changes;
    paVar3 = &local_80.field_2;
    psVar11 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_80.field_2._M_allocated_capacity = *psVar11;
      local_80.field_2._8_8_ = plVar7[3];
      local_80._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar11;
      local_80._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_80._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,&local_80
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar3) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    this->current_step = k;
    p_Var9 = (this->clocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(this->clocks)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var2) {
      do {
        id = *(int64_t *)(p_Var9 + 1);
        iVar4 = *(int *)&p_Var9[1]._M_parent;
        if (iVar4 == 2) {
          get_bv_identifier_abi_cxx11_(&local_60,this,id);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x117c71);
          psVar11 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_80.field_2._M_allocated_capacity = *psVar11;
            local_80.field_2._8_8_ = puVar8[3];
            local_80._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_80.field_2._M_allocated_capacity = *psVar11;
            local_80._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_80._M_string_length = puVar8[1];
          *puVar8 = psVar11;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                     &local_80);
LAB_0010cc7e:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar3) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
        }
        else {
          if (iVar4 == 1) {
            get_bv_identifier_abi_cxx11_(&local_60,this,id);
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x117122);
            psVar11 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_80.field_2._M_allocated_capacity = *psVar11;
              local_80.field_2._8_8_ = puVar8[3];
              local_80._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              local_80.field_2._M_allocated_capacity = *psVar11;
              local_80._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_80._M_string_length = puVar8[1];
            *puVar8 = psVar11;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                       &local_80);
            goto LAB_0010cc7e;
          }
          if (iVar4 == 0) {
            get_bv_identifier_abi_cxx11_(&local_60,this,id);
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x117c71);
            psVar11 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_80.field_2._M_allocated_capacity = *psVar11;
              local_80.field_2._8_8_ = puVar8[3];
              local_80._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              local_80.field_2._M_allocated_capacity = *psVar11;
              local_80._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_80._M_string_length = puVar8[1];
            *puVar8 = psVar11;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                       &local_80);
            goto LAB_0010cc7e;
          }
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var2);
    }
  }
  return;
}

Assistant:

void
BtorSimVCDWriter::update_time (int64_t k)
{
  if (current_step < k)
  {
    if (k > 0)
    {
      value_changes.push_back ("#" + std::to_string (k * 10 - 5));
      for (auto clk : clocks)
      {
        switch (clk.second)
        {
          case POSEDGE:
            value_changes.push_back ("0" + get_bv_identifier (clk.first));
            break;
          case NEGEDGE:
            value_changes.push_back ("1" + get_bv_identifier (clk.first));
            break;
          case EVENT: break;
        }
      }
    }
    value_changes.push_back ("#" + std::to_string (k * 10));
    current_step = k;
    for (auto clk : clocks)
    {
      switch (clk.second)
      {
        case POSEDGE:
          value_changes.push_back ("1" + get_bv_identifier (clk.first));
          break;
        case NEGEDGE:
          value_changes.push_back ("0" + get_bv_identifier (clk.first));
          break;
        case EVENT:
          value_changes.push_back ("1" + get_bv_identifier (clk.first));
          break;
      }
    }
  }
}